

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void tar_mode_x(bsdtar *bsdtar)

{
  int iVar1;
  archive *a;
  char *msg;
  
  a = archive_write_disk_new();
  if (a != (archive *)0x0) {
    if ((bsdtar->flags & 0x200) == 0) {
      archive_write_disk_set_standard_lookup(a);
    }
    archive_write_disk_set_options(a,bsdtar->extract_flags);
    msg = (char *)0x78;
    read_archive(bsdtar,'x',a);
    iVar1 = unmatched_inclusions_warn(bsdtar->matching,msg);
    if (iVar1 != 0) {
      bsdtar->return_value = 1;
    }
    archive_write_free(a);
    return;
  }
  lafe_errc(1,0xc,"Cannot allocate disk writer object");
}

Assistant:

void
tar_mode_x(struct bsdtar *bsdtar)
{
	struct archive *writer;

	writer = archive_write_disk_new();
	if (writer == NULL)
		lafe_errc(1, ENOMEM, "Cannot allocate disk writer object");
	if ((bsdtar->flags & OPTFLAG_NUMERIC_OWNER) == 0)
		archive_write_disk_set_standard_lookup(writer);
	archive_write_disk_set_options(writer, bsdtar->extract_flags);

	read_archive(bsdtar, 'x', writer);

	if (unmatched_inclusions_warn(bsdtar->matching,
	    "Not found in archive") != 0)
		bsdtar->return_value = 1;
	archive_write_free(writer);
}